

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O2

bool __thiscall FileManager::seekVirtual(FileManager *this,int64_t virtualAddress)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = checkActiveFile(this);
  if ((!bVar2) ||
     (peVar1 = (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, iVar3 = (*peVar1->_vptr_AssemblerFile[9])(peVar1,virtualAddress),
     (char)iVar3 == '\0')) {
    return false;
  }
  if (Global.memoryMode != true) {
    return true;
  }
  iVar3 = SymbolTable::findSection(&Global.symbolTable,virtualAddress);
  if (iVar3 == -1) {
    return true;
  }
  Global.Section = iVar3;
  return true;
}

Assistant:

bool FileManager::seekVirtual(int64_t virtualAddress)
{
	if (!checkActiveFile())
		return false;

	bool result = activeFile->seekVirtual(virtualAddress);
	if (result && Global.memoryMode)
	{
		int sec = Global.symbolTable.findSection(virtualAddress);
		if (sec != -1)
			Global.Section = sec;
	}

	return result;
}